

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O2

void __thiscall
libtorrent::utp_stream::
async_connect<std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (utp_stream *this,endpoint_type *endpoint,
          _Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *handler)

{
  io_context *this_00;
  _Bind_result<void,_std::_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_(boost::asio::error::basic_errors)>
  _Stack_38;
  
  if (this->m_impl != (utp_socket_impl *)0x0) {
    std::function<void(boost::system::error_code_const&)>::operator=
              ((function<void(boost::system::error_code_const&)> *)this,handler);
    do_connect(this,endpoint);
    return;
  }
  this_00 = this->m_io_service;
  std::
  _Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  ::_Bind(&_Stack_38._M_f,handler);
  _Stack_38._M_bound_args.super__Tuple_impl<0UL,_boost::asio::error::basic_errors>.
  super__Head_base<0UL,_boost::asio::error::basic_errors,_false>._M_head_impl =
       (_Tuple_impl<0UL,_boost::asio::error::basic_errors>)
       (_Head_base<0UL,_boost::asio::error::basic_errors,_false>)0x6b;
  boost::asio::io_context::
  post<std::_Bind_result<void,std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>(boost::asio::error::basic_errors)>>
            (this_00,&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&_Stack_38._M_f._M_bound_args.
                     super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
                     .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>.
                     _M_head_impl + 8));
  return;
}

Assistant:

void async_connect(endpoint_type const& endpoint, Handler const& handler)
	{
		if (m_impl == nullptr)
		{
			m_io_service.post(std::bind<void>(handler, boost::asio::error::not_connected));
			return;
		}

		m_connect_handler = handler;
		do_connect(endpoint);
	}